

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.h
# Opt level: O1

int __thiscall imrt::Station::get_nb_apertures(Station *this,string *strategy)

{
  int iVar1;
  int iVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)strategy);
  if (iVar1 == 0) {
    iVar1 = (int)((ulong)((long)(this->intensity).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this->intensity).super__Vector_base<double,_std::allocator<double>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)strategy);
    iVar1 = -1;
    if (iVar2 == 0) {
      iVar1 = (int)(this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
  }
  return iVar1;
}

Assistant:

int get_nb_apertures(string strategy){
    if(strategy=="dao_ls")
       return (intensity.size());
    else if(strategy=="ibo_ls")
       return (int2nb.size());
    return(-1);
  }